

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_run_mode.h
# Opt level: O2

int32_t __thiscall charls::context_run_mode::get_golomb_code(context_run_mode *this)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = (uint)this->n_;
  iVar1 = 0;
  while( true ) {
    if ((int)((uint)(this->n_ >> 1) * this->run_interruption_type_ + this->a_) <= (int)uVar2) {
      return iVar1;
    }
    if (iVar1 == 0x21) break;
    uVar2 = uVar2 * 2;
    iVar1 = iVar1 + 1;
  }
  __assert_fail("k <= 32",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/context_run_mode.h"
                ,0x2a,"int32_t charls::context_run_mode::get_golomb_code() const");
}

Assistant:

FORCE_INLINE int32_t get_golomb_code() const noexcept
    {
        const int32_t temp{a_ + (n_ >> 1) * run_interruption_type_};
        int32_t n_test{n_};
        int32_t k{};
        for (; n_test < temp; ++k)
        {
            n_test <<= 1;
            ASSERT(k <= 32);
        }
        return k;
    }